

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int autoVacuumCommit(Btree *p)

{
  BtShared *pBt_00;
  Pager *pPager_00;
  sqlite3 *psVar1;
  Pgno PVar2;
  int iVar3;
  u32 uVar4;
  int local_50;
  int iDb;
  Pgno nOrig;
  Pgno iFree;
  Pgno nVac;
  Pgno nFree;
  Pgno nFin;
  sqlite3 *db;
  BtShared *pBt;
  Pager *pPager;
  int rc;
  Btree *p_local;
  
  pPager._4_4_ = 0;
  pBt_00 = p->pBt;
  pPager_00 = pBt_00->pPager;
  invalidateAllOverflowCache(pBt_00);
  if (pBt_00->incrVacuum == '\0') {
    iDb = btreePagecount(pBt_00);
    PVar2 = ptrmapPageno(pBt_00,iDb);
    if ((PVar2 == iDb) || (iDb == (uint)sqlite3PendingByte / pBt_00->pageSize + 1)) {
      iVar3 = sqlite3CorruptError(0x119c9);
      return iVar3;
    }
    uVar4 = sqlite3Get4byte(pBt_00->pPage1->aData + 0x24);
    psVar1 = p->db;
    nOrig = uVar4;
    if (psVar1->xAutovacPages != (_func_uint_void_ptr_char_ptr_u32_u32_u32 *)0x0) {
      local_50 = 0;
      while ((local_50 < psVar1->nDb && (psVar1->aDb[local_50].pBt != p))) {
        local_50 = local_50 + 1;
      }
      nOrig = (*psVar1->xAutovacPages)
                        (psVar1->pAutovacPagesArg,psVar1->aDb[local_50].zDbSName,iDb,uVar4,
                         pBt_00->pageSize);
      if (uVar4 < nOrig) {
        nOrig = uVar4;
      }
      if (nOrig == 0) {
        return 0;
      }
    }
    PVar2 = finalDbSize(pBt_00,iDb,nOrig);
    if ((uint)iDb < PVar2) {
      iVar3 = sqlite3CorruptError(0x119e4);
      return iVar3;
    }
    if (PVar2 < (uint)iDb) {
      pPager._4_4_ = saveAllCursors(pBt_00,0,(BtCursor *)0x0);
    }
    for (; PVar2 < (uint)iDb && pPager._4_4_ == 0; iDb = iDb + -1) {
      pPager._4_4_ = incrVacuumStep(pBt_00,PVar2,iDb,(uint)(nOrig == uVar4));
    }
    if (((pPager._4_4_ == 0x65) || (pPager._4_4_ == 0)) && (uVar4 != 0)) {
      pPager._4_4_ = sqlite3PagerWrite(pBt_00->pPage1->pDbPage);
      if (nOrig == uVar4) {
        sqlite3Put4byte(pBt_00->pPage1->aData + 0x20,0);
        sqlite3Put4byte(pBt_00->pPage1->aData + 0x24,0);
      }
      sqlite3Put4byte(pBt_00->pPage1->aData + 0x1c,PVar2);
      pBt_00->bDoTruncate = '\x01';
      pBt_00->nPage = PVar2;
    }
    if (pPager._4_4_ != 0) {
      sqlite3PagerRollback(pPager_00);
    }
  }
  return pPager._4_4_;
}

Assistant:

static int autoVacuumCommit(Btree *p){
  int rc = SQLITE_OK;
  Pager *pPager;
  BtShared *pBt;
  sqlite3 *db;
  VVA_ONLY( int nRef );

  assert( p!=0 );
  pBt = p->pBt;
  pPager = pBt->pPager;
  VVA_ONLY( nRef = sqlite3PagerRefcount(pPager); )

  assert( sqlite3_mutex_held(pBt->mutex) );
  invalidateAllOverflowCache(pBt);
  assert(pBt->autoVacuum);
  if( !pBt->incrVacuum ){
    Pgno nFin;         /* Number of pages in database after autovacuuming */
    Pgno nFree;        /* Number of pages on the freelist initially */
    Pgno nVac;         /* Number of pages to vacuum */
    Pgno iFree;        /* The next page to be freed */
    Pgno nOrig;        /* Database size before freeing */

    nOrig = btreePagecount(pBt);
    if( PTRMAP_ISPAGE(pBt, nOrig) || nOrig==PENDING_BYTE_PAGE(pBt) ){
      /* It is not possible to create a database for which the final page
      ** is either a pointer-map page or the pending-byte page. If one
      ** is encountered, this indicates corruption.
      */
      return SQLITE_CORRUPT_BKPT;
    }

    nFree = get4byte(&pBt->pPage1->aData[36]);
    db = p->db;
    if( db->xAutovacPages ){
      int iDb;
      for(iDb=0; ALWAYS(iDb<db->nDb); iDb++){
        if( db->aDb[iDb].pBt==p ) break;
      }
      nVac = db->xAutovacPages(
        db->pAutovacPagesArg,
        db->aDb[iDb].zDbSName,
        nOrig,
        nFree,
        pBt->pageSize
      );
      if( nVac>nFree ){
        nVac = nFree;
      }
      if( nVac==0 ){
        return SQLITE_OK;
      }
    }else{
      nVac = nFree;
    }
    nFin = finalDbSize(pBt, nOrig, nVac);
    if( nFin>nOrig ) return SQLITE_CORRUPT_BKPT;
    if( nFin<nOrig ){
      rc = saveAllCursors(pBt, 0, 0);
    }
    for(iFree=nOrig; iFree>nFin && rc==SQLITE_OK; iFree--){
      rc = incrVacuumStep(pBt, nFin, iFree, nVac==nFree);
    }
    if( (rc==SQLITE_DONE || rc==SQLITE_OK) && nFree>0 ){
      rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
      if( nVac==nFree ){
        put4byte(&pBt->pPage1->aData[32], 0);
        put4byte(&pBt->pPage1->aData[36], 0);
      }
      put4byte(&pBt->pPage1->aData[28], nFin);
      pBt->bDoTruncate = 1;
      pBt->nPage = nFin;
    }
    if( rc!=SQLITE_OK ){
      sqlite3PagerRollback(pPager);
    }
  }

  assert( nRef>=sqlite3PagerRefcount(pPager) );
  return rc;
}